

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcg-op.c
# Opt level: O1

void tcg_gen_rem_i64_arm(TCGContext_conflict *tcg_ctx,TCGv_i64 ret,TCGv_i64 arg1,TCGv_i64 arg2)

{
  TCGTemp *ts;
  TCGOp *pTVar1;
  uintptr_t o_2;
  uintptr_t o;
  uintptr_t o_1;
  
  ts = tcg_temp_new_internal_arm(tcg_ctx,TCG_TYPE_I64,false);
  tcg_gen_sari_i64_arm(tcg_ctx,(TCGv_i64)((long)ts - (long)tcg_ctx),arg1,0x3f);
  pTVar1 = tcg_emit_op_arm(tcg_ctx,INDEX_op_div2_i64);
  pTVar1->args[0] = (TCGArg)ts;
  pTVar1->args[1] = (TCGArg)(ret + (long)tcg_ctx);
  pTVar1->args[2] = (TCGArg)(arg1 + (long)tcg_ctx);
  pTVar1->args[3] = (TCGArg)ts;
  pTVar1->args[4] = (TCGArg)(arg2 + (long)tcg_ctx);
  tcg_temp_free_internal_arm(tcg_ctx,ts);
  return;
}

Assistant:

void tcg_gen_rem_i64(TCGContext *tcg_ctx, TCGv_i64 ret, TCGv_i64 arg1, TCGv_i64 arg2)
{
#if TCG_TARGET_HAS_rem_i64
        tcg_gen_op3_i64(tcg_ctx, INDEX_op_rem_i64, ret, arg1, arg2);
#elif TCG_TARGET_HAS_div_i64
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_op3_i64(tcg_ctx, INDEX_op_div_i64, t0, arg1, arg2);
        tcg_gen_mul_i64(tcg_ctx, t0, t0, arg2);
        tcg_gen_sub_i64(tcg_ctx, ret, arg1, t0);
        tcg_temp_free_i64(tcg_ctx, t0);
#elif TCG_TARGET_HAS_div2_i64
        TCGv_i64 t0 = tcg_temp_new_i64(tcg_ctx);
        tcg_gen_sari_i64(tcg_ctx, t0, arg1, 63);
        tcg_gen_op5_i64(tcg_ctx, INDEX_op_div2_i64, t0, ret, arg1, t0, arg2);
        tcg_temp_free_i64(tcg_ctx, t0);
#else
        gen_helper_rem_i64(tcg_ctx, ret, arg1, arg2);
#endif
}